

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O2

Ivy_Obj_t * Ivy_TableLookup(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  char *__assertion;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Ivy_IsComplement(pObj)";
    uVar1 = 0x4b;
LAB_005facc5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyTable.c"
                  ,uVar1,"Ivy_Obj_t *Ivy_TableLookup(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
  if (0xfffffffc < uVar1 - 7) {
    if ((uVar1 != 4) &&
       ((pObj->pFanin0 == (Ivy_Obj_t *)0x0 ||
        (*(int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe) < 1)))) {
      __assertion = "Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0";
      uVar1 = 0x4e;
      goto LAB_005facc5;
    }
    pIVar2 = pObj->pFanin1;
    if ((pIVar2 != (Ivy_Obj_t *)0x0) && (*(int *)((ulong)pIVar2 & 0xfffffffffffffffe) != 0)) {
      if (pObj->pFanin0 == (Ivy_Obj_t *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *(int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      }
      if (*(int *)((ulong)pIVar2 & 0xfffffffffffffffe) <= iVar3) {
        __assertion = "Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj)";
        uVar1 = 0x4f;
        goto LAB_005facc5;
      }
    }
    if ((*(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0xc) != 0) &&
       ((pIVar2 == (Ivy_Obj_t *)0x0 || (*(int *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 0xc) != 0)))
       ) {
      for (uVar1 = Ivy_Hash(pObj,p->nTableSize); p->pTable[(int)uVar1] != 0;
          uVar1 = (int)(uVar1 + 1) % p->nTableSize) {
        pIVar2 = Ivy_ManObj(p,p->pTable[(int)uVar1]);
        if (((pIVar2->pFanin0 == pObj->pFanin0) && (pIVar2->pFanin1 == pObj->pFanin1)) &&
           (((*(uint *)&pObj->field_0x8 ^ *(uint *)&pIVar2->field_0x8) & 0x60f) == 0)) {
          return pIVar2;
        }
      }
    }
  }
  return (Ivy_Obj_t *)0x0;
}

Assistant:

Ivy_Obj_t * Ivy_TableLookup( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEntry;
    int i;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return NULL;
    assert( Ivy_ObjIsLatch(pObj) || Ivy_ObjFaninId0(pObj) > 0 );
    assert( Ivy_ObjFaninId1(pObj) == 0 || Ivy_ObjFaninId0(pObj) < Ivy_ObjFaninId1(pObj) );
    if ( Ivy_ObjFanin0(pObj)->nRefs == 0 || (Ivy_ObjChild1(pObj) && Ivy_ObjFanin1(pObj)->nRefs == 0) )
        return NULL;
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
    {
        pEntry = Ivy_ManObj( p, p->pTable[i] );
        if ( Ivy_ObjChild0(pEntry) == Ivy_ObjChild0(pObj) && 
             Ivy_ObjChild1(pEntry) == Ivy_ObjChild1(pObj) && 
             Ivy_ObjInit(pEntry) == Ivy_ObjInit(pObj) && 
             Ivy_ObjType(pEntry) == Ivy_ObjType(pObj) )
            return pEntry;
    }
    return NULL;
}